

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O3

CompiledMethod *
Lodtalk::CompiledMethod::newMethodWithHeader
          (VMContext *context,size_t numberOfBytes,CompiledMethodHeader header)

{
  undefined1 auVar1 [16];
  CompiledMethod *pCVar2;
  ProtoObject PVar3;
  ulong uVar4;
  long lVar5;
  ProtoObject PVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  uVar4 = numberOfBytes + 0xf;
  if (numberOfBytes + 8 <= (uVar4 & 0xfffffffffffffff8)) {
    PVar6.object_header_ = (ObjectHeader)(uVar4 >> 3);
    pCVar2 = (CompiledMethod *)
             VMContext::allocateObjectMemory(context,(uVar4 & 0xfffffffffffffff8) + 8,0x7f7 < uVar4)
    ;
    PVar3.object_header_ = (ObjectHeader)0xff;
    if ((ulong)PVar6.object_header_ < 0xff) {
      PVar3.object_header_ = PVar6.object_header_;
    }
    (pCVar2->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.super_Collection.
    super_Object.super_ProtoObject.object_header_ =
         (ObjectHeader)
         ((ulong)((uint)numberOfBytes & 7) << 0x23 | (ulong)PVar3.object_header_ |
          (ulong)(((uint)pCVar2 & 0xfffffff8) << 7) | 0x158c000000000 |
         (ulong)(pCVar2->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.
                super_Collection.super_Object.super_ProtoObject.object_header_ & 0x30700000300);
    if (0x7f7 < uVar4) {
      pCVar2[-1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
      super_Collection.super_Object.super_ProtoObject.object_header_ = PVar6.object_header_;
    }
    auVar1 = _DAT_001516b0;
    uVar4 = (ulong)header.oop.field_0 >> 1 & 0xffff;
    auVar7._8_4_ = (int)uVar4;
    auVar7._0_8_ = uVar4;
    auVar7._12_4_ = 0;
    lVar5 = 0;
    auVar7 = auVar7 | _DAT_001516b0;
    auVar8 = _DAT_001516a0;
    do {
      auVar10 = auVar8 ^ auVar1;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        pCVar2[lVar5 + 1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
        super_Collection.super_Object.super_ProtoObject.object_header_ = (ObjectHeader)&NilObject;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        pCVar2[lVar5 + 2].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
        super_Collection.super_Object.super_ProtoObject.object_header_ = (ObjectHeader)&NilObject;
      }
      lVar5 = lVar5 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
    } while ((uVar4 - ((header.oop.field_0._0_4_ >> 1 & 1) != 0)) + 2 != lVar5);
    pCVar2[1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.super_Collection.
    super_Object.super_ProtoObject.object_header_ = (ObjectHeader)header.oop.field_0;
    return pCVar2;
  }
  __assert_fail("slotCount*wordSize >= numberOfBytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Method.cpp"
                ,0x24,
                "static CompiledMethod *Lodtalk::CompiledMethod::newMethodWithHeader(VMContext *, size_t, CompiledMethodHeader)"
               );
}

Assistant:

CompiledMethod *CompiledMethod::newMethodWithHeader(VMContext *context, size_t numberOfBytes, CompiledMethodHeader header)
{
	// Add the method header size
	numberOfBytes += sizeof(void*);

	// Compute the some masks
	const size_t wordSize = sizeof(void*);
	const size_t wordMask = wordSize -1;

	// Compute the number of slots
	size_t slotCount = ((numberOfBytes + wordSize - 1) & (~wordMask)) / wordSize;
	size_t extraFormatBits = numberOfBytes & wordMask;
	assert(slotCount*wordSize >= numberOfBytes);

	// Compute the header size.
	auto headerSize = sizeof(ObjectHeader);
	auto bodySize = slotCount*sizeof(void*);
	auto objectSize = headerSize + bodySize;

	// Allocate the compiled method
    auto bigObject = slotCount >= 255;
	auto methodData = context->allocateObjectMemory(objectSize, bigObject);
	auto objectHeader = reinterpret_cast<ObjectHeader*> (methodData);

	// Set the method header
	objectHeader->slotCount = slotCount < 255 ? slotCount : 255;
	objectHeader->identityHash = generateIdentityHash(methodData);
	objectHeader->objectFormat = (unsigned int)(OF_COMPILED_METHOD + extraFormatBits);
	objectHeader->classIndex = SCI_CompiledMethod;
	if(bigObject)
        reinterpret_cast<uint64_t*> (objectHeader)[-1] = slotCount;

	// Initialize the literals to nil
	auto methodBody = reinterpret_cast<Oop*> (methodData + headerSize);
	auto literalCount = header.getLiteralCount();
	for(size_t i = 0; i < literalCount + 1; ++i )
		methodBody[i] = nilOop();

	// Set the method header
	auto methodHeader = reinterpret_cast<CompiledMethodHeader*> (methodBody);
	*methodHeader = header;

	// Return the compiled method.
	return reinterpret_cast<CompiledMethod*> (methodData);
}